

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O1

void __thiscall
xray_re::xr_vbuf::xr_vbuf
          (xr_vbuf *this,size_t n,fvector3 *points,fvector3 *normals,fvector2 *texcoords)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  fvector3 *pfVar3;
  fvector2 *__dest;
  ulong uVar4;
  
  (this->super_xr_flexbuf).m_owner = true;
  (this->super_xr_flexbuf)._vptr_xr_flexbuf = (_func_int **)&PTR__xr_vbuf_00248788;
  this->m_lightmaps = (fvector2 *)0x0;
  this->m_influences = (finfluence *)0x0;
  this->m_colors = (fcolor *)0x0;
  (this->super_xr_flexbuf).m_size = n;
  if (points == (fvector3 *)0x0) {
    pfVar3 = (fvector3 *)0x0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = n;
    uVar4 = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0xc),8) == 0) {
      uVar4 = SUB168(auVar1 * ZEXT816(0xc),0);
    }
    pfVar3 = (fvector3 *)operator_new__(uVar4);
    if (n != 0) {
      memcpy(pfVar3,points,n * 0xc);
    }
  }
  this->m_points = pfVar3;
  if (normals == (fvector3 *)0x0) {
    pfVar3 = (fvector3 *)0x0;
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = n;
    uVar4 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0xc),8) == 0) {
      uVar4 = SUB168(auVar2 * ZEXT816(0xc),0);
    }
    pfVar3 = (fvector3 *)operator_new__(uVar4);
    if (n != 0) {
      memcpy(pfVar3,normals,n * 0xc);
    }
  }
  this->m_normals = pfVar3;
  if (texcoords == (fvector2 *)0x0) {
    __dest = (fvector2 *)0x0;
  }
  else {
    __dest = (fvector2 *)operator_new__(-(ulong)(n >> 0x3d != 0) | n * 8);
    if (n != 0) {
      memcpy(__dest,texcoords,n * 8);
    }
  }
  this->m_texcoords = __dest;
  make_signature(this);
  return;
}

Assistant:

xr_vbuf::xr_vbuf(size_t n, const fvector3* points, const fvector3* normals, const fvector2* texcoords):
	m_lightmaps(0), m_influences(0), m_colors(0)
{
	set_owner(true);
	set_size(n);
	m_points = duplicate(points);
	m_normals = duplicate(normals);
	m_texcoords = duplicate(texcoords);
	make_signature();
}